

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_52::crashHandler(anon_unknown_52 *this,int signo,siginfo_t *info,void *context)

{
  undefined1 auVar1 [8];
  char *__n;
  char *pcVar2;
  void *__buf;
  ArrayPtr<void_*> space;
  ArrayPtr<void_*const> AVar3;
  char *pcVar4;
  undefined1 local_18d;
  int signo_local;
  undefined1 local_188 [8];
  size_t sStack_180;
  UnwindDetector local_178;
  undefined4 uStack_174;
  String local_168;
  String message;
  char *local_130;
  void *traceSpace [32];
  
  signo_local = (int)this;
  space.size_ = 2;
  space.ptr = (void **)&DAT_00000020;
  AVar3 = getStackTrace((kj *)traceSpace,space,(uint)context);
  local_130 = strsignal(signo_local);
  message.content._0_16_ = AVar3;
  strArray<kj::ArrayPtr<void*const>&>
            ((String *)local_188,(kj *)&message,(ArrayPtr<void_*const> *)0x2845d1,(char *)context);
  pcVar4 = (char *)0x2351cc;
  stringifyStackTrace((ArrayPtr<void_*const>)traceSpace._8_16_);
  local_18d = 10;
  __n = ": ";
  str<char_const(&)[22],int&,char_const(&)[3],char*,char_const(&)[9],kj::String,kj::String,char>
            (&message,(kj *)"*** Received signal #",(char (*) [22])&signo_local,(int *)0x261684,
             (char (*) [3])&local_130,(char **)0x2859df,(char (*) [9])local_188,&local_168,
             (String *)&local_18d,pcVar4);
  pcVar2 = (char *)local_168.content.size_;
  pcVar4 = local_168.content.ptr;
  if (local_168.content.ptr != (char *)0x0) {
    local_168.content.ptr = (char *)0x0;
    local_168.content.size_ = 0;
    (**(local_168.content.disposer)->_vptr_ArrayDisposer)
              (local_168.content.disposer,pcVar4,1,pcVar2,pcVar2,0);
    __n = pcVar2;
  }
  pcVar4 = (char *)sStack_180;
  auVar1 = local_188;
  if (local_188 != (undefined1  [8])0x0) {
    local_188 = (undefined1  [8])0x0;
    sStack_180 = 0;
    (*(code *)**(undefined8 **)CONCAT44(uStack_174,local_178.uncaughtCount))
              ((undefined8 *)CONCAT44(uStack_174,local_178.uncaughtCount),auVar1,1,pcVar4,pcVar4,0);
    __n = pcVar4;
  }
  local_188 = (undefined1  [8])&PTR__FdOutputStream_002d0390;
  sStack_180 = 0xffffffff00000002;
  local_178.uncaughtCount = std::uncaught_exceptions();
  pcVar4 = (char *)message.content.size_;
  if (message.content.size_ != 0) {
    pcVar4 = message.content.ptr;
  }
  __buf = (void *)0x0;
  if (message.content.size_ != 0) {
    __buf = (void *)(message.content.size_ - 1);
  }
  FdOutputStream::write((FdOutputStream *)local_188,(int)pcVar4,__buf,(size_t)__n);
  FdOutputStream::~FdOutputStream((FdOutputStream *)local_188);
  _exit(1);
}

Assistant:

void crashHandler(int signo, siginfo_t* info, void* context) {
  void* traceSpace[32];

  // ignoreCount = 2 to ignore crashHandler() and signal trampoline.
  auto trace = getStackTrace(traceSpace, 2);

  auto message = kj::str("*** Received signal #", signo, ": ", strsignal(signo),
                         "\nstack: ", stringifyStackTraceAddresses(trace),
                         stringifyStackTrace(trace), '\n');

  FdOutputStream(STDERR_FILENO).write(message.begin(), message.size());
  _exit(1);
}